

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_stmt * sqlite3_next_stmt(sqlite3 *pDb,sqlite3_stmt *pStmt)

{
  Vdbe *local_20;
  sqlite3_stmt *pNext;
  sqlite3_stmt *pStmt_local;
  sqlite3 *pDb_local;
  
  sqlite3_mutex_enter(pDb->mutex);
  if (pStmt == (sqlite3_stmt *)0x0) {
    local_20 = pDb->pVdbe;
  }
  else {
    local_20 = *(Vdbe **)(pStmt + 0x10);
  }
  sqlite3_mutex_leave(pDb->mutex);
  return (sqlite3_stmt *)local_20;
}

Assistant:

SQLITE_API sqlite3_stmt *sqlite3_next_stmt(sqlite3 *pDb, sqlite3_stmt *pStmt){
  sqlite3_stmt *pNext;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(pDb) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  sqlite3_mutex_enter(pDb->mutex);
  if( pStmt==0 ){
    pNext = (sqlite3_stmt*)pDb->pVdbe;
  }else{
    pNext = (sqlite3_stmt*)((Vdbe*)pStmt)->pVNext;
  }
  sqlite3_mutex_leave(pDb->mutex);
  return pNext;
}